

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

PropertyId __thiscall
Js::FunctionBody::GetReferencedPropertyIdWithMapIndexWithLock(FunctionBody *this,uint mapIndex)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  void *pvVar4;
  undefined4 *puVar5;
  
  pvVar4 = FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,ReferencedPropertyIdMap);
  if (pvVar4 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10f3,"(this->GetReferencedPropertyIdMapWithLock())",
                                "this->GetReferencedPropertyIdMapWithLock()");
    if (!bVar2) goto LAB_007738fc;
    *puVar5 = 0;
  }
  uVar3 = GetCountField(this,ReferencedPropertyIdCount);
  if (uVar3 <= mapIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10f4,"(mapIndex < this->GetReferencedPropertyIdCount())",
                                "mapIndex < this->GetReferencedPropertyIdCount()");
    if (!bVar2) {
LAB_007738fc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pvVar4 = FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,ReferencedPropertyIdMap);
  return *(PropertyId *)((long)pvVar4 + (ulong)mapIndex * 4);
}

Assistant:

PropertyId FunctionBody::GetReferencedPropertyIdWithMapIndexWithLock(uint mapIndex)
    {
        Assert(this->GetReferencedPropertyIdMapWithLock());
        Assert(mapIndex < this->GetReferencedPropertyIdCount());
        return this->GetReferencedPropertyIdMapWithLock()[mapIndex];
    }